

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockSettingsHandler_ClearAll(ImGuiContext_conflict1 *ctx,ImGuiSettingsHandler *param_2)

{
  int *piVar1;
  ImGuiDockNodeSettings *pIVar2;
  
  pIVar2 = (ctx->DockContext).NodesSettings.Data;
  if (pIVar2 != (ImGuiDockNodeSettings *)0x0) {
    (ctx->DockContext).NodesSettings.Size = 0;
    (ctx->DockContext).NodesSettings.Capacity = 0;
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    (ctx->DockContext).NodesSettings.Data = (ImGuiDockNodeSettings *)0x0;
  }
  DockContextClearNodes(ctx,0,true);
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiDockContext* dc  = &ctx->DockContext;
    dc->NodesSettings.clear();
    DockContextClearNodes(ctx, 0, true);
}